

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O0

void __thiscall
Annotations::Add(Annotations *this,int side,double x,double y,char *net,char *part,char *pin,
                char *note)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  int r;
  char *zErrMsg;
  char sql [10240];
  undefined8 local_2850;
  undefined1 local_2848 [10312];
  
  local_2850 = 0;
  sqlite3_snprintf(in_XMM0_Qa,in_XMM1_Qa,0x2800,local_2848,
                   "INSERT into annotations ( visible, side, posx, posy, net, part, pin, note ) \t\t\tvalues ( 1, %d, %0.0f, %0.0f, \'%s\', \'%s\', \'%s\', \'%q\' );"
                   ,in_ESI,in_RDX,in_RCX);
  iVar1 = sqlite3_exec(*(undefined8 *)(in_RDI + 0x20),local_2848,0,0,&local_2850);
  if (iVar1 == 0) {
    if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
      fprintf(_stdout,"Records created successfully\n");
    }
  }
  else {
    if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
      fprintf(_stderr,"SQL error: %s\n",local_2850);
    }
    sqlite3_free(local_2850);
  }
  return;
}

Assistant:

void Annotations::Add(int side, double x, double y, const char *net, const char *part, const char *pin, const char *note) {
	char sql[10240];
	char *zErrMsg = 0;
	int r;

	sqlite3_snprintf(sizeof(sql),
	                 sql,
	                 "INSERT into annotations ( visible, side, posx, posy, net, part, pin, note ) \
			values ( 1, %d, %0.0f, %0.0f, '%s', '%s', '%s', '%q' );",
	                 side,
	                 x,
	                 y,
	                 net,
	                 part,
	                 pin,
	                 note);

	r = sqlite3_exec(sqldb, sql, NULL, 0, &zErrMsg);
	if (r != SQLITE_OK) {
		if (debug) fprintf(stderr, "SQL error: %s\n", zErrMsg);
		sqlite3_free(zErrMsg);
	} else {
		if (debug) fprintf(stdout, "Records created successfully\n");
	}
}